

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

WaitForkStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::WaitForkStatementSyntax,slang::syntax::WaitForkStatementSyntax_const&>
          (BumpAllocator *this,WaitForkStatementSyntax *args)

{
  WaitForkStatementSyntax *this_00;
  
  this_00 = (WaitForkStatementSyntax *)allocate(this,0x88,8);
  slang::syntax::WaitForkStatementSyntax::WaitForkStatementSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }